

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglChooseConfigReference.cpp
# Opt level: O1

bool __thiscall
deqp::egl::SurfaceConfig::compareTo
          (SurfaceConfig *this,SurfaceConfig *b,BVec4 *specifiedRGBColors,
          BVec2 *specifiedLuminanceColors,bool yuvPlaneBppSpecified)

{
  CompareFunc p_Var1;
  bool bVar2;
  bool bVar3;
  TestError *this_00;
  CompareFunc *pp_Var4;
  ulong uVar5;
  
  bVar2 = operator==(this,b);
  if (bVar2) {
    bVar3 = false;
  }
  else {
    pp_Var4 = compareTo::compareFuncs;
    uVar5 = 0;
    bVar2 = false;
    do {
      if (uVar5 == 3) {
        bVar3 = compareColorBufferBits
                          (this,b,specifiedRGBColors,specifiedLuminanceColors,yuvPlaneBppSpecified);
        if (bVar3) {
          bVar3 = true;
          break;
        }
        bVar3 = compareColorBufferBits
                          (b,this,specifiedRGBColors,specifiedLuminanceColors,yuvPlaneBppSpecified);
        if (bVar3) {
LAB_00e98b35:
          bVar3 = false;
          break;
        }
      }
      else {
        p_Var1 = *pp_Var4;
        bVar3 = (*p_Var1)(this,b);
        if (bVar3) {
          bVar3 = true;
          break;
        }
        bVar3 = (*p_Var1)(b,this);
        if (bVar3) goto LAB_00e98b35;
      }
      bVar2 = 10 < uVar5;
      uVar5 = uVar5 + 1;
      pp_Var4 = pp_Var4 + 1;
    } while (uVar5 != 0xc);
    if (bVar2) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Unable to compare configs - duplicate ID?",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglChooseConfigReference.cpp"
                 ,0x119);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
  }
  return bVar3;
}

Assistant:

bool compareTo (const SurfaceConfig& b, const tcu::BVec4& specifiedRGBColors, const tcu::BVec2& specifiedLuminanceColors, bool yuvPlaneBppSpecified) const
	{
		static const SurfaceConfig::CompareFunc compareFuncs[] =
		{
			SurfaceConfig::compareCaveat,
			SurfaceConfig::compareColorBufferType,
			SurfaceConfig::compareColorComponentType,
			DE_NULL, // SurfaceConfig::compareColorBufferBits,
			SurfaceConfig::compareAttributeSmaller<EGL_BUFFER_SIZE>,
			SurfaceConfig::compareAttributeSmaller<EGL_SAMPLE_BUFFERS>,
			SurfaceConfig::compareAttributeSmaller<EGL_SAMPLES>,
			SurfaceConfig::compareAttributeSmaller<EGL_DEPTH_SIZE>,
			SurfaceConfig::compareAttributeSmaller<EGL_STENCIL_SIZE>,
			SurfaceConfig::compareAttributeSmaller<EGL_ALPHA_MASK_SIZE>,
			SurfaceConfig::compareYuvOrder,
			SurfaceConfig::compareAttributeSmaller<EGL_CONFIG_ID>
		};

		if (*this == b)
			return false; // std::sort() can compare object to itself.

		for (int ndx = 0; ndx < (int)DE_LENGTH_OF_ARRAY(compareFuncs); ndx++)
		{
			if (!compareFuncs[ndx])
			{
				if (compareColorBufferBits(*this, b, specifiedRGBColors, specifiedLuminanceColors, yuvPlaneBppSpecified))
					return true;
				else if (compareColorBufferBits(b, *this, specifiedRGBColors, specifiedLuminanceColors, yuvPlaneBppSpecified))
					return false;

				continue;
			}

			if (compareFuncs[ndx](*this, b))
				return true;
			else if (compareFuncs[ndx](b, *this))
				return false;
		}

		TCU_FAIL("Unable to compare configs - duplicate ID?");
	}